

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O1

void __thiscall
Am_Point_Array_Data::Am_Point_Array_Data(Am_Point_Array_Data *this,int *coords,int num_coords)

{
  pointer *ppaVar1;
  iterator __position;
  undefined8 in_RAX;
  ulong uVar2;
  XPoint xp;
  undefined8 uStack_38;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e45d8;
  (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  uStack_38 = in_RAX;
  std::vector<XPoint,_std::allocator<XPoint>_>::reserve(&this->points,(long)(num_coords / 2));
  if (1 < num_coords) {
    uVar2 = 0;
    do {
      uStack_38 = CONCAT26((short)coords[uVar2 + 1],
                           CONCAT24((short)coords[uVar2],(undefined4)uStack_38));
      __position._M_current =
           (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<XPoint,std::allocator<XPoint>>::_M_realloc_insert<XPoint_const&>
                  ((vector<XPoint,std::allocator<XPoint>> *)&this->points,__position,
                   (anon_struct_4_2_94730a64 *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = uStack_38._4_4_;
        ppaVar1 = &(this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      uVar2 = uVar2 + 2;
    } while (uVar2 < (uint)((num_coords / 2) * 2));
  }
  return;
}

Assistant:

Am_Point_Array_Data::Am_Point_Array_Data(int *coords, int num_coords)
{
  const int size = num_coords / 2;
  points.reserve(size);
  for (int i = 0; i < (2 * size); i += 2) {
    const XPoint xp = {static_cast<short>(coords[i]),
                       static_cast<short>(coords[i + 1])};
    points.push_back(xp);
  }
}